

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_psk_key_exchange_modes_parse_clienthello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  size_t sVar2;
  uint8_t *s;
  void *pvVar3;
  undefined1 local_38 [8];
  CBS ke_modes;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    ke_modes.len = (size_t)contents;
    iVar1 = CBS_get_u8_length_prefixed(contents,(CBS *)local_38);
    if (((iVar1 != 0) && (sVar2 = CBS_len((CBS *)local_38), sVar2 != 0)) &&
       (sVar2 = CBS_len((CBS *)ke_modes.len), sVar2 == 0)) {
      s = CBS_data((CBS *)local_38);
      sVar2 = CBS_len((CBS *)local_38);
      pvVar3 = OPENSSL_memchr(s,1,sVar2);
      *(uint *)&hs->field_0x6c8 =
           *(uint *)&hs->field_0x6c8 & 0xffffffef | (uint)(pvVar3 != (void *)0x0) << 4;
      return true;
    }
    *out_alert = '2';
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_psk_key_exchange_modes_parse_clienthello(SSL_HANDSHAKE *hs,
                                                         uint8_t *out_alert,
                                                         CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  CBS ke_modes;
  if (!CBS_get_u8_length_prefixed(contents, &ke_modes) ||  //
      CBS_len(&ke_modes) == 0 ||                           //
      CBS_len(contents) != 0) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // We only support tickets with PSK_DHE_KE.
  hs->accept_psk_mode = OPENSSL_memchr(CBS_data(&ke_modes), SSL_PSK_DHE_KE,
                                       CBS_len(&ke_modes)) != NULL;

  return true;
}